

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

void __thiscall itis::AVLTree<short>::clear(AVLTree<short> *this)

{
  value_type __x;
  bool bVar1;
  reference ppAVar2;
  AVLTreeNode<short> *node;
  undefined1 local_28 [8];
  vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_> stack;
  AVLTree<short> *this_local;
  
  stack.super__Vector_base<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>::vector
            ((vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_> *)
             local_28);
  if (this->root != (AVLTreeNode<short> *)0x0) {
    std::vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>::push_back
              ((vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_> *)
               local_28,&this->root);
  }
  while (bVar1 = std::
                 vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>::
                 empty((vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>
                        *)local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppAVar2 = std::vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>::
              back((vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>
                    *)local_28);
    __x = *ppAVar2;
    std::vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>::pop_back
              ((vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_> *)
               local_28);
    if (__x->left != (AVLTreeNode<short> *)0x0) {
      std::vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>::
      push_back((vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_> *)
                local_28,&__x->left);
    }
    if (__x->right != (value_type)0x0) {
      std::vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>::
      push_back((vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_> *)
                local_28,&__x->right);
    }
    this->_size = this->_size + -1;
    if (__x != (value_type)0x0) {
      operator_delete(__x,0x20);
    }
  }
  this->root = (AVLTreeNode<short> *)0x0;
  std::vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_>::~vector
            ((vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_> *)
             local_28);
  return;
}

Assistant:

void AVLTree<T>::clear() {
    std::vector<AVLTreeNode<T> *> stack;

    if (root != nullptr) {
      stack.push_back(root);
    }

    while (!stack.empty()) {
      AVLTreeNode<T> *node = stack.back();
      stack.pop_back();

      if (node->left != nullptr) {
        stack.push_back(node->left);
      }

      if (node->right != nullptr) {
        stack.push_back(node->right);
      }

      _size--;
      delete node;
    }

    root = nullptr;
  }